

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

void pem_pbkdf1(uchar *key,size_t keylen,uchar *iv,uchar *pwd,size_t pwdlen)

{
  size_t local_a0;
  size_t use_len;
  uchar md5sum [16];
  mbedtls_md5_context md5_ctx;
  size_t pwdlen_local;
  uchar *pwd_local;
  uchar *iv_local;
  size_t keylen_local;
  uchar *key_local;
  
  mbedtls_md5_init((mbedtls_md5_context *)(md5sum + 8));
  mbedtls_md5_starts((mbedtls_md5_context *)(md5sum + 8));
  mbedtls_md5_update((mbedtls_md5_context *)(md5sum + 8),pwd,pwdlen);
  mbedtls_md5_update((mbedtls_md5_context *)(md5sum + 8),iv,8);
  mbedtls_md5_finish((mbedtls_md5_context *)(md5sum + 8),(uchar *)&use_len);
  if (keylen < 0x11) {
    memcpy(key,&use_len,keylen);
    mbedtls_md5_free((mbedtls_md5_context *)(md5sum + 8));
    mbedtls_zeroize(&use_len,0x10);
  }
  else {
    *(size_t *)key = use_len;
    *(undefined8 *)(key + 8) = md5sum._0_8_;
    mbedtls_md5_starts((mbedtls_md5_context *)(md5sum + 8));
    mbedtls_md5_update((mbedtls_md5_context *)(md5sum + 8),(uchar *)&use_len,0x10);
    mbedtls_md5_update((mbedtls_md5_context *)(md5sum + 8),pwd,pwdlen);
    mbedtls_md5_update((mbedtls_md5_context *)(md5sum + 8),iv,8);
    mbedtls_md5_finish((mbedtls_md5_context *)(md5sum + 8),(uchar *)&use_len);
    local_a0 = 0x10;
    if (keylen < 0x20) {
      local_a0 = keylen - 0x10;
    }
    memcpy(key + 0x10,&use_len,local_a0);
    mbedtls_md5_free((mbedtls_md5_context *)(md5sum + 8));
    mbedtls_zeroize(&use_len,0x10);
  }
  return;
}

Assistant:

static void pem_pbkdf1( unsigned char *key, size_t keylen,
                        unsigned char *iv,
                        const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_md5_context md5_ctx;
    unsigned char md5sum[16];
    size_t use_len;

    mbedtls_md5_init( &md5_ctx );

    /*
     * key[ 0..15] = MD5(pwd || IV)
     */
    mbedtls_md5_starts( &md5_ctx );
    mbedtls_md5_update( &md5_ctx, pwd, pwdlen );
    mbedtls_md5_update( &md5_ctx, iv,  8 );
    mbedtls_md5_finish( &md5_ctx, md5sum );

    if( keylen <= 16 )
    {
        memcpy( key, md5sum, keylen );

        mbedtls_md5_free( &md5_ctx );
        mbedtls_zeroize( md5sum, 16 );
        return;
    }

    memcpy( key, md5sum, 16 );

    /*
     * key[16..23] = MD5(key[ 0..15] || pwd || IV])
     */
    mbedtls_md5_starts( &md5_ctx );
    mbedtls_md5_update( &md5_ctx, md5sum,  16 );
    mbedtls_md5_update( &md5_ctx, pwd, pwdlen );
    mbedtls_md5_update( &md5_ctx, iv,  8 );
    mbedtls_md5_finish( &md5_ctx, md5sum );

    use_len = 16;
    if( keylen < 32 )
        use_len = keylen - 16;

    memcpy( key + 16, md5sum, use_len );

    mbedtls_md5_free( &md5_ctx );
    mbedtls_zeroize( md5sum, 16 );
}